

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall
randomx::JitCompilerX86::generateProgramPrologue
          (JitCompilerX86 *this,Program *prog,ProgramConfiguration *pcfg)

{
  undefined1 uVar1;
  int iVar2;
  uint8_t *puVar3;
  uint32_t uVar4;
  Instruction *in_RDX;
  Program *in_RSI;
  JitCompilerX86 *in_RDI;
  Instruction *instr;
  uint i_1;
  uint i;
  JitCompilerX86 *in_stack_ffffffffffffffb8;
  JitCompilerX86 *in_stack_ffffffffffffffc0;
  uint local_20;
  uint i_00;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x151882);
  for (i_00 = 0; i_00 < 8; i_00 = i_00 + 1) {
    in_RDI->registerUsage[i_00] = -1;
  }
  in_RDI->codePos = prologueSize;
  puVar3 = in_RDI->code;
  iVar2 = in_RDI->codePos;
  *(Instruction *)(puVar3 + (long)iVar2 + -0x30) = *in_RDX;
  *(Instruction *)(puVar3 + (long)iVar2 + -0x28) = in_RDX[1];
  memcpy(in_RDI->code + in_RDI->codePos,codeLoopLoad,(long)loopLoadSize);
  in_RDI->codePos = loopLoadSize + in_RDI->codePos;
  local_20 = 0;
  while( true ) {
    uVar4 = Program::getSize(in_RSI);
    if (uVar4 <= local_20) break;
    in_stack_ffffffffffffffb8 = (JitCompilerX86 *)Program::operator()(in_RSI,local_20);
    *(byte *)((long)&(in_stack_ffffffffffffffb8->instructionOffsets).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start + 2) =
         *(uint8_t *)
          ((long)&(in_stack_ffffffffffffffb8->instructionOffsets).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + 2) % 8;
    *(byte *)((long)&(in_stack_ffffffffffffffb8->instructionOffsets).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start + 1) =
         *(uint8_t *)
          ((long)&(in_stack_ffffffffffffffb8->instructionOffsets).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + 1) % 8;
    in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffb8;
    generateCode((JitCompilerX86 *)in_RSI,in_RDX,i_00);
    local_20 = local_20 + 1;
  }
  emit<2ul>(in_stack_ffffffffffffffc0,(uint8_t (*) [2])in_stack_ffffffffffffffb8);
  uVar1 = in_RDX[3].opcode;
  emitByte(in_RDI,uVar1 + 0xc0);
  emit<2ul>(in_stack_ffffffffffffffc0,(uint8_t (*) [2])in_stack_ffffffffffffffb8);
  emitByte(in_RDI,(char)in_RDX[3].imm32 + 0xc0);
  return;
}

Assistant:

void JitCompilerX86::generateProgramPrologue(Program& prog, ProgramConfiguration& pcfg) {
		instructionOffsets.clear();
		for (unsigned i = 0; i < RegistersCount; ++i) {
			registerUsage[i] = -1;
		}

		codePos = prologueSize;
		memcpy(code + codePos - 48, &pcfg.eMask, sizeof(pcfg.eMask));
		memcpy(code + codePos, codeLoopLoad, loopLoadSize);
		codePos += loopLoadSize;
		for (unsigned i = 0; i < prog.getSize(); ++i) {
			Instruction& instr = prog(i);
			instr.src %= RegistersCount;
			instr.dst %= RegistersCount;
			generateCode(instr, i);
		}
		emit(REX_MOV_RR);
		emitByte(0xc0 + pcfg.readReg2);
		emit(REX_XOR_EAX);
		emitByte(0xc0 + pcfg.readReg3);
	}